

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall glslang::TType::updateArraySizes(TType *this,TType *type)

{
  TArraySizes *this_00;
  TArraySizes *from;
  
  this_00 = this->arraySizes;
  if (this_00 == (TArraySizes *)0x0) {
    __assert_fail("arraySizes != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x7f3,"void glslang::TType::updateArraySizes(const TType &)");
  }
  from = type->arraySizes;
  if (from != (TArraySizes *)0x0) {
    this_00->implicitArraySize = from->implicitArraySize;
    this_00->variablyIndexed = from->variablyIndexed;
    TSmallArrayVector::operator=(&this_00->sizes,&from->sizes);
    this_00->implicitlySized = from->implicitlySized;
    return;
  }
  __assert_fail("type.arraySizes != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x7f4,"void glslang::TType::updateArraySizes(const TType &)");
}

Assistant:

void updateArraySizes(const TType& type)
    {
        // For when we may already be sharing existing array descriptors,
        // keeping the pointers the same, just updating the contents.
        assert(arraySizes != nullptr);
        assert(type.arraySizes != nullptr);
        *arraySizes = *type.arraySizes;
    }